

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

void __thiscall CChat::AddLine(CChat *this,char *pLine,int ClientID,int Mode,int TargetID)

{
  long lVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  CLine *pCVar5;
  int64 iVar6;
  char *pcVar7;
  CConfig *pCVar8;
  int64 iVar9;
  int in_ECX;
  uint in_EDX;
  char *in_RSI;
  CChat *in_RDI;
  uint in_R8D;
  long in_FS_OFFSET;
  float Chn;
  int64 Now;
  int ChatType;
  int NameCID;
  int Length_1;
  char *pHL;
  CLine *pCurLine;
  char *p;
  bool Highlighted;
  int Code;
  char *pStrOld;
  char *pEnd;
  int Length;
  char *pStr;
  char aBuf [1024];
  float Vol;
  int in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb5c;
  CChat *in_stack_fffffffffffffb60;
  char *in_stack_fffffffffffffb68;
  bool local_481;
  int local_46c;
  uint local_468;
  char *local_450;
  char *local_438;
  int local_430;
  char *local_410;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*in_RSI != '\0') &&
      (((int)in_EDX < 1 ||
       (bVar3 = IsClientIgnored(in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c), !bVar3)))) &&
     ((in_ECX != 3 ||
      ((((-1 < (int)in_EDX && (-1 < (int)in_R8D)) &&
        (bVar3 = IsClientIgnored(in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c), !bVar3)) &&
       ((in_EDX == ((in_RDI->super_CComponent).m_pClient)->m_LocalClientID ||
        (in_R8D == ((in_RDI->super_CComponent).m_pClient)->m_LocalClientID)))))))) {
    local_430 = 0;
    local_438 = (char *)0x0;
    local_410 = in_RSI;
    do {
      pcVar2 = local_410;
      if (*local_410 == '\0') goto LAB_0014cb36;
      iVar4 = str_utf8_decode(&local_410);
      iVar4 = str_utf8_is_whitespace(iVar4);
      if (iVar4 == 0) {
        local_438 = (char *)0x0;
      }
      else if (local_438 == (char *)0x0) {
        local_438 = pcVar2;
      }
      local_430 = local_430 + 1;
    } while (local_430 < 0x7f);
    *local_410 = '\0';
LAB_0014cb36:
    if (local_438 != (char *)0x0) {
      *local_438 = '\0';
    }
    bVar3 = false;
    local_450 = in_RSI;
    while (pcVar2 = local_450, pcVar7 = local_450, *local_450 != '\0') {
      do {
        local_450 = pcVar7;
        if (*local_450 == '\0') goto LAB_0014cba9;
        pcVar7 = local_450 + 1;
      } while (*local_450 != '\n');
      *local_450 = '\0';
      local_450 = local_450 + 1;
LAB_0014cba9:
      in_RDI->m_CurrentLine = (in_RDI->m_CurrentLine + 1) % 0xfa;
      pCVar5 = in_RDI->m_aLines + in_RDI->m_CurrentLine;
      iVar6 = time_get();
      pCVar5->m_Time = iVar6;
      (pCVar5->m_Size).field_1.y = -1.0;
      pCVar5->m_ClientID = in_EDX;
      pCVar5->m_TargetID = in_R8D;
      pCVar5->m_Mode = in_ECX;
      pCVar5->m_NameColor = -2;
      bVar3 = false;
      if (((in_ECX != 3) && (-1 < (int)in_EDX)) &&
         ((in_EDX != ((in_RDI->super_CComponent).m_pClient)->m_LocalClientID &&
          (pcVar7 = str_find_nocase(in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60),
          pcVar7 != (char *)0x0)))) {
        iVar4 = str_length((char *)0x14cce9);
        if ((pcVar2 == pcVar7) || (pcVar7[-1] == ' ')) {
          if ((pcVar7[iVar4] == '\0') || (pcVar7[iVar4] == ' ')) {
            bVar3 = true;
          }
          if ((pcVar7[iVar4] == ':') && ((pcVar7[iVar4 + 1] == '\0' || (pcVar7[iVar4 + 1] == ' '))))
          {
            bVar3 = true;
          }
        }
        in_RDI->m_CompletionFav = in_EDX;
      }
      pCVar5->m_Highlighted = bVar3;
      local_468 = in_EDX;
      if (((in_ECX == 3) && (in_EDX == ((in_RDI->super_CComponent).m_pClient)->m_LocalClientID)) &&
         (-1 < (int)in_R8D)) {
        local_468 = in_R8D;
      }
      if (in_EDX == 0xffffffff) {
        pCVar5->m_aName[0] = '\0';
        str_format(pCVar5->m_aText,0x200,"*** %s",pcVar2);
      }
      else if (in_EDX == 0xfffffffe) {
        pCVar5->m_aName[0] = '\0';
        str_format(pCVar5->m_aText,0x200,anon_var_dwarf_3bc74,pcVar2);
      }
      else {
        if (((in_RDI->super_CComponent).m_pClient)->m_aClients[(int)in_EDX].m_Team == -1) {
          pCVar5->m_NameColor = -1;
        }
        if (((((in_RDI->super_CComponent).m_pClient)->m_GameInfo).m_GameFlags & 1U) != 0) {
          if (((in_RDI->super_CComponent).m_pClient)->m_aClients[(int)in_EDX].m_Team == 0) {
            pCVar5->m_NameColor = 0;
          }
          else if (((in_RDI->super_CComponent).m_pClient)->m_aClients[(int)in_EDX].m_Team == 1) {
            pCVar5->m_NameColor = 1;
          }
        }
        str_format(pCVar5->m_aName,0x41,"%s",
                   ((in_RDI->super_CComponent).m_pClient)->m_aClients + (int)local_468);
        str_format(pCVar5->m_aText,0x200,"%s",pcVar2);
      }
      str_format(&stack0xfffffffffffffbf8,0x400,"%2d: %s: %s",(ulong)local_468,pCVar5->m_aName,
                 pCVar5->m_aText);
      in_stack_fffffffffffffb60 = (CChat *)CComponent::Console((CComponent *)0x14cfba);
      in_stack_fffffffffffffb68 = GetModeName(in_RDI,in_ECX);
      local_481 = bVar3 != false || in_ECX == 3;
      (*(in_stack_fffffffffffffb60->super_CComponent)._vptr_CComponent[0x19])
                (in_stack_fffffffffffffb60,0,in_stack_fffffffffffffb68,&stack0xfffffffffffffbf8,
                 (ulong)local_481);
    }
    if ((in_ECX == 3) && (((in_RDI->super_CComponent).m_pClient)->m_LocalClientID != in_EDX)) {
      in_RDI->m_LastWhisperFrom = in_EDX;
    }
    pCVar8 = CComponent::Config((CComponent *)0x14d06e);
    if (pCVar8->m_ClShowChat != 0) {
      if ((int)in_EDX < 0) {
        local_46c = 0;
      }
      else if ((bVar3 == false) && (in_ECX != 3)) {
        local_46c = 2;
      }
      else {
        local_46c = 1;
      }
      iVar6 = time_get();
      Chn = (float)(iVar6 - in_RDI->m_aLastSoundPlayed[local_46c]);
      iVar9 = time_freq();
      if ((float)iVar9 * 0.3 <= Chn) {
        Vol = (float)((ulong)((in_RDI->super_CComponent).m_pClient)->m_pSounds >> 0x20);
        GetChatSound(in_RDI,local_46c);
        CSounds::Play((CSounds *)in_stack_fffffffffffffb60,(int)Chn,in_stack_fffffffffffffb58,Vol);
        in_RDI->m_aLastSoundPlayed[local_46c] = iVar6;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CChat::AddLine(const char *pLine, int ClientID, int Mode, int TargetID)
{
	if(*pLine == 0 || (ClientID > 0 && IsClientIgnored(ClientID)))
		return;

	if(Mode == CHAT_WHISPER)
	{
		if(ClientID < 0 || TargetID < 0 || IsClientIgnored(TargetID))
			return;
		// should be sender or receiver
		if(ClientID != m_pClient->m_LocalClientID && TargetID != m_pClient->m_LocalClientID)
			return;
	}

	// trim right and set maximum length to 128 utf8-characters
	int Length = 0;
	const char *pStr = pLine;
	const char *pEnd = 0;
	while(*pStr)
	{
		const char *pStrOld = pStr;
		int Code = str_utf8_decode(&pStr);

		// check if unicode is not empty
		if(!str_utf8_is_whitespace(Code))
		{
			pEnd = 0;
		}
		else if(pEnd == 0)
			pEnd = pStrOld;

		if(++Length >= 127)
		{
			*(const_cast<char *>(pStr)) = 0;
			break;
		}
	}
	if(pEnd != 0)
		*(const_cast<char *>(pEnd)) = 0;

	bool Highlighted = false;
	char *p = const_cast<char*>(pLine);
	while(*p)
	{
		pLine = p;
		// find line separator and strip multiline
		while(*p)
		{
			if(*p++ == '\n')
			{
				*(p-1) = 0;
				break;
			}
		}

		m_CurrentLine = (m_CurrentLine+1)%MAX_LINES;
		CLine *pCurLine = &m_aLines[m_CurrentLine];

		pCurLine->m_Time = time_get();
		pCurLine->m_Size.y = -1.0f;
		pCurLine->m_ClientID = ClientID;
		pCurLine->m_TargetID = TargetID;
		pCurLine->m_Mode = Mode;
		pCurLine->m_NameColor = -2;

		// check for highlighted name
		Highlighted = false;
		// do not highlight our own messages, whispers and system messages
		if(Mode != CHAT_WHISPER && ClientID >= 0 && ClientID != m_pClient->m_LocalClientID)
		{
			const char *pHL = str_find_nocase(pLine, m_pClient->m_aClients[m_pClient->m_LocalClientID].m_aName);
			if(pHL)
			{
				int Length = str_length(m_pClient->m_aClients[m_pClient->m_LocalClientID].m_aName);
				if((pLine == pHL || pHL[-1] == ' ')) // "" or " " before
				{
					if((pHL[Length] == 0 || pHL[Length] == ' ')) // "" or " " after
						Highlighted = true;
					if(pHL[Length] == ':' && (pHL[Length+1] == 0 || pHL[Length+1] == ' ')) // ":" or ": " after
						Highlighted = true;
				}
				m_CompletionFav = ClientID;
			}
		}

		pCurLine->m_Highlighted =  Highlighted;

		int NameCID = ClientID;
		if(Mode == CHAT_WHISPER && ClientID == m_pClient->m_LocalClientID && TargetID >= 0)
			NameCID = TargetID;

		if(ClientID == SERVER_MSG)
		{
			pCurLine->m_aName[0] = '\0';
			str_format(pCurLine->m_aText, sizeof(pCurLine->m_aText), "*** %s", pLine);
		}
		else if(ClientID == CLIENT_MSG)
		{
			pCurLine->m_aName[0] = '\0';
			str_format(pCurLine->m_aText, sizeof(pCurLine->m_aText), "— %s", pLine);
		}
		else
		{
			if(m_pClient->m_aClients[ClientID].m_Team == TEAM_SPECTATORS)
				pCurLine->m_NameColor = TEAM_SPECTATORS;

			if(m_pClient->m_GameInfo.m_GameFlags&GAMEFLAG_TEAMS)
			{
				if(m_pClient->m_aClients[ClientID].m_Team == TEAM_RED)
					pCurLine->m_NameColor = TEAM_RED;
				else if(m_pClient->m_aClients[ClientID].m_Team == TEAM_BLUE)
					pCurLine->m_NameColor = TEAM_BLUE;
			}

			str_format(pCurLine->m_aName, sizeof(pCurLine->m_aName), "%s", m_pClient->m_aClients[NameCID].m_aName);
			str_format(pCurLine->m_aText, sizeof(pCurLine->m_aText), "%s", pLine);
		}

		char aBuf[1024];
		str_format(aBuf, sizeof(aBuf), "%2d: %s: %s", NameCID, pCurLine->m_aName, pCurLine->m_aText);
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, GetModeName(Mode), aBuf, Highlighted || Mode == CHAT_WHISPER);
	}

	if(Mode == CHAT_WHISPER && m_pClient->m_LocalClientID != ClientID)
		m_LastWhisperFrom = ClientID; // we received a whisper

	// play sound
	if(Config()->m_ClShowChat)
	{
		int ChatType;
		if(ClientID < 0)
			ChatType = CHAT_SERVER;
		else if(Highlighted || Mode == CHAT_WHISPER)
			ChatType = CHAT_HIGHLIGHT;
		else
			ChatType = CHAT_CLIENT;

		const int64 Now = time_get();
		if(Now - m_aLastSoundPlayed[ChatType] >= time_freq() * 0.3f)
		{
			m_pClient->m_pSounds->Play(CSounds::CHN_GUI, GetChatSound(ChatType), 0);
			m_aLastSoundPlayed[ChatType] = Now;
		}
	}
}